

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashListEntry_GetKey(ktxHashListEntry *This,uint *pKeyLen,char **ppKey)

{
  if (ppKey != (char **)0x0 && pKeyLen != (uint *)0x0) {
    *pKeyLen = This->keyLen;
    *ppKey = This->key;
    return KTX_SUCCESS;
  }
  return KTX_INVALID_VALUE;
}

Assistant:

KTX_error_code
ktxHashListEntry_GetKey(ktxHashListEntry* This,
                        unsigned int* pKeyLen, char** ppKey)
{
    if (pKeyLen && ppKey) {
        ktxKVListEntry* kv = (ktxKVListEntry*)This;
        *pKeyLen = kv->keyLen;
        *ppKey = kv->key;
        return KTX_SUCCESS;
    } else
        return KTX_INVALID_VALUE;
}